

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O1

sequence * toml::detail::syntax::comment(sequence *__return_storage_ptr__,spec *s)

{
  pointer __p;
  repeat_at_least local_60;
  either local_48;
  character local_28;
  __uniq_ptr_impl<toml::detail::either,_std::default_delete<toml::detail::either>_> local_18;
  
  local_28.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005687c8;
  local_28.value_ = '#';
  allowed_comment_char(&local_48,s);
  local_60.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_00568a40;
  local_60.length_ = 0;
  local_60.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       operator_new(0x20);
  *(undefined ***)
   local_60.other_.scanner_._M_t.
   super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
   ._M_t.
   super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
   .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = &PTR__either_00568990;
  *(pointer *)
   ((long)local_60.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8) =
       local_48.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)local_60.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x10) =
       local_48.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)local_60.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x18) =
       local_48.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18._M_t.
  super__Tuple_impl<0UL,_toml::detail::either_*,_std::default_delete<toml::detail::either>_>.
  super__Head_base<0UL,_toml::detail::either_*,_false>._M_head_impl =
       (tuple<toml::detail::either_*,_std::default_delete<toml::detail::either>_>)
       (_Tuple_impl<0UL,_toml::detail::either_*,_std::default_delete<toml::detail::either>_>)0x0;
  std::unique_ptr<toml::detail::either,_std::default_delete<toml::detail::either>_>::~unique_ptr
            ((unique_ptr<toml::detail::either,_std::default_delete<toml::detail::either>_> *)
             &local_18);
  sequence::sequence<toml::detail::character,toml::detail::repeat_at_least>
            (__return_storage_ptr__,&local_28,&local_60);
  if (local_60.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_60.other_.scanner_._M_t.
                          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl +
                8))();
  }
  local_60.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_48.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence comment(const spec& s)
{
    return sequence(character(char_type('#')),
                    repeat_at_least(0, allowed_comment_char(s)));
}